

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool __thiscall
basist::basisu_transcoder::get_image_level_desc
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index,uint32_t *orig_width,uint32_t *orig_height,uint32_t *total_blocks)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  uint32_t data_size_00;
  
  bVar2 = validate_header_quick(this,pData,data_size);
  if (((bVar2) &&
      (uVar3 = find_first_slice_index(this,pData,data_size_00,image_index,level_index),
      -1 < (int)uVar3)) && (image_index < *(uint3 *)((long)pData + 0x11))) {
    uVar1 = *(uint *)((long)pData + 0x41);
    lVar4 = (ulong)uVar3 * 0x17;
    *orig_width = (uint)*(ushort *)((long)pData + lVar4 + 5 + (ulong)uVar1);
    *orig_height = (uint)*(ushort *)((long)pData + lVar4 + 7 + (ulong)uVar1);
    *total_blocks =
         (uint)*(ushort *)((long)pData + lVar4 + 0xb + (ulong)uVar1) *
         (uint)*(ushort *)((long)pData + lVar4 + 9 + (ulong)uVar1);
    return true;
  }
  return false;
}

Assistant:

bool basisu_transcoder::get_image_level_desc(const void* pData, uint32_t data_size, uint32_t image_index, uint32_t level_index, uint32_t& orig_width, uint32_t& orig_height, uint32_t& total_blocks) const
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_desc: header validation failed\n");
			return false;
		}

		int slice_index = find_first_slice_index(pData, data_size, image_index, level_index);
		if (slice_index < 0)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_desc: failed finding slice\n");
			return false;
		}

		const basis_file_header* pHeader = static_cast<const basis_file_header*>(pData);

		if (image_index >= pHeader->m_total_images)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_desc: invalid image_index\n");
			return false;
		}

		const basis_slice_desc* pSlice_descs = reinterpret_cast<const basis_slice_desc*>(static_cast<const uint8_t*>(pData) + pHeader->m_slice_desc_file_ofs);

		const basis_slice_desc& slice_desc = pSlice_descs[slice_index];

		orig_width = slice_desc.m_orig_width;
		orig_height = slice_desc.m_orig_height;
		total_blocks = slice_desc.m_num_blocks_x * slice_desc.m_num_blocks_y;

		return true;
	}